

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprAnd(Fts5Expr **pp1,Fts5Expr *p2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Fts5ExprNode *pFVar5;
  void *__src;
  Fts5ExprNearset *in_RSI;
  Fts5ExprNode *in_RDI;
  long in_FS_OFFSET;
  int i;
  Fts5ExprPhrase **ap;
  int nPhrase;
  Fts5Expr *p1;
  Fts5Parse sParse;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar6;
  Fts5ExprNode *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&stack0xffffffffffffffc8,0xaa,0x30);
  memset(&stack0xffffffffffffffc8,0,0x30);
  lVar4._0_4_ = in_RDI->eType;
  lVar4._4_4_ = in_RDI->bEof;
  if ((lVar4 == 0) || (in_RSI == (Fts5ExprNearset *)0x0)) {
    if (in_RSI != (Fts5ExprNearset *)0x0) {
      *(Fts5ExprNearset **)in_RDI = in_RSI;
    }
  }
  else {
    lVar4 = *(long *)in_RDI;
    iVar1 = *(int *)(lVar4 + 0x1c);
    iVar2 = *(int *)((long)in_RSI->apPhrase + 4);
    pFVar5 = sqlite3Fts5ParseNode
                       ((Fts5Parse *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,in_RDI,in_RSI);
    *(Fts5ExprNode **)(lVar4 + 0x10) = pFVar5;
    *(undefined8 *)&in_RSI->nPhrase = 0;
    if (in_stack_ffffffffffffffd8 == 0) {
      __src = sqlite3_realloc((void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                              0);
      if (__src == (void *)0x0) {
        in_stack_ffffffffffffffd8 = 7;
      }
      else {
        memmove((void *)((long)__src + (long)*(int *)((long)in_RSI->apPhrase + 4) * 8),__src,
                (long)*(int *)(lVar4 + 0x1c) << 3);
        for (iVar6 = 0; iVar6 < *(int *)((long)in_RSI->apPhrase + 4); iVar6 = iVar6 + 1) {
          *(undefined8 *)((long)__src + (long)iVar6 * 8) =
               *(undefined8 *)(*(long *)(in_RSI + 1) + (long)iVar6 * 8);
        }
        *(int *)(lVar4 + 0x1c) = iVar1 + iVar2;
        *(void **)(lVar4 + 0x20) = __src;
      }
    }
    sqlite3_free((void *)0x26bfeb);
    sqlite3_free((void *)0x26bff5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return in_stack_ffffffffffffffd8;
}

Assistant:

static int sqlite3Fts5ExprAnd(Fts5Expr **pp1, Fts5Expr *p2){
  Fts5Parse sParse;
  memset(&sParse, 0, sizeof(sParse));

  if( *pp1 && p2 ){
    Fts5Expr *p1 = *pp1;
    int nPhrase = p1->nPhrase + p2->nPhrase;

    p1->pRoot = sqlite3Fts5ParseNode(&sParse, FTS5_AND, p1->pRoot, p2->pRoot,0);
    p2->pRoot = 0;

    if( sParse.rc==SQLITE_OK ){
      Fts5ExprPhrase **ap = (Fts5ExprPhrase**)sqlite3_realloc(
          p1->apExprPhrase, nPhrase * sizeof(Fts5ExprPhrase*)
      );
      if( ap==0 ){
        sParse.rc = SQLITE_NOMEM;
      }else{
        int i;
        memmove(&ap[p2->nPhrase], ap, p1->nPhrase*sizeof(Fts5ExprPhrase*));
        for(i=0; i<p2->nPhrase; i++){
          ap[i] = p2->apExprPhrase[i];
        }
        p1->nPhrase = nPhrase;
        p1->apExprPhrase = ap;
      }
    }
    sqlite3_free(p2->apExprPhrase);
    sqlite3_free(p2);
  }else if( p2 ){
    *pp1 = p2;
  }

  return sParse.rc;
}